

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

float * Jf_ManInitRefs(Jf_Man_t *pMan)

{
  Gia_Man_t *pGVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  float *pfVar7;
  ulong uVar8;
  uint uVar9;
  Gia_Obj_t *pGVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  Gia_Obj_t *pGVar15;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  pGVar1 = pMan->pGia;
  if (pGVar1->pRefs != (int *)0x0) {
    __assert_fail("p->pRefs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0xf9,"float *Jf_ManInitRefs(Jf_Man_t *)");
  }
  uVar9 = pGVar1->nObjs;
  uVar13 = (ulong)(int)uVar9;
  piVar5 = (int *)calloc(uVar13,4);
  pGVar1->pRefs = piVar5;
  if (0 < (long)uVar13) {
    lVar14 = 0;
    lVar11 = 0;
    do {
      uVar9 = (uint)uVar13;
      pGVar15 = pGVar1->pObjs;
      if (pGVar15 == (Gia_Obj_t *)0x0) break;
      pGVar6 = (Gia_Obj_t *)(&pGVar15->field_0x0 + lVar14);
      uVar8 = *(ulong *)pGVar6 & 0x1fffffff;
      if (uVar8 != 0x1fffffff && -1 < (int)*(ulong *)pGVar6) {
        iVar4 = (int)uVar8;
        pGVar10 = (Gia_Obj_t *)(lVar14 + (ulong)(uint)(iVar4 * 4) * -3 + (long)pGVar15);
        if ((pGVar10 < pGVar15) || (pGVar15 + (uVar13 & 0xffffffff) <= pGVar10)) goto LAB_006cf02b;
        piVar2 = pGVar1->pRefs;
        piVar5 = piVar2 + (int)(lVar14 + (ulong)(uint)(iVar4 << 2) * -3 >> 2) * -0x55555555;
        *piVar5 = *piVar5 + 1;
        uVar12 = (uint)*(undefined8 *)pGVar6;
        uVar9 = (uint)((ulong)*(undefined8 *)pGVar6 >> 0x20);
        if (-1 < (int)uVar12) {
          uVar12 = uVar12 & 0x1fffffff;
          if ((uVar12 != 0x1fffffff) && (uVar12 == (uVar9 & 0x1fffffff))) goto LAB_006ced1d;
        }
        uVar9 = uVar9 & 0x1fffffff;
        pGVar10 = (Gia_Obj_t *)(lVar14 + (ulong)(uVar9 * 4) * -3 + (long)pGVar15);
        if ((pGVar10 < pGVar15) || (pGVar15 + pGVar1->nObjs <= pGVar10)) goto LAB_006cf02b;
        piVar2 = piVar2 + (int)(lVar14 + (ulong)(uVar9 << 2) * -3 >> 2) * -0x55555555;
        *piVar2 = *piVar2 + 1;
        iVar4 = Gia_ObjIsMuxType(pGVar6);
        if (iVar4 != 0) {
          pGVar6 = Gia_ObjRecognizeMux(pGVar6,&local_40,&local_38);
          pGVar6 = (Gia_Obj_t *)((ulong)pGVar6 & 0xfffffffffffffffe);
          pGVar15 = pGVar1->pObjs;
          if ((pGVar6 < pGVar15) || (pGVar15 + pGVar1->nObjs <= pGVar6)) goto LAB_006cf02b;
          piVar2 = pGVar1->pRefs;
          piVar5 = piVar2 + (int)((ulong)((long)pGVar6 - (long)pGVar15) >> 2) * -0x55555555;
          *piVar5 = *piVar5 + -1;
          pGVar6 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
          if (pGVar6 == (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe)) {
            if ((pGVar6 < pGVar15) || (pGVar15 + pGVar1->nObjs <= pGVar6)) goto LAB_006cf02b;
            piVar2 = piVar2 + (int)((ulong)((long)pGVar6 - (long)pGVar15) >> 2) * -0x55555555;
            *piVar2 = *piVar2 + -1;
          }
        }
      }
LAB_006ced1d:
      lVar11 = lVar11 + 1;
      uVar9 = pGVar1->nObjs;
      uVar13 = (ulong)(int)uVar9;
      lVar14 = lVar14 + 0xc;
    } while (lVar11 < (long)uVar13);
  }
  pVVar3 = pGVar1->vCos;
  if (0 < pVVar3->nSize) {
    piVar5 = pVVar3->pArray;
    lVar11 = 0;
    do {
      iVar4 = piVar5[lVar11];
      if ((long)iVar4 < 0) {
LAB_006cf04a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar9 = pGVar1->nObjs;
      if ((int)uVar9 <= iVar4) goto LAB_006cf04a;
      pGVar15 = pGVar1->pObjs;
      if (pGVar15 == (Gia_Obj_t *)0x0) goto LAB_006cedca;
      pGVar6 = pGVar15 + iVar4 + -(ulong)((uint)*(undefined8 *)(pGVar15 + iVar4) & 0x1fffffff);
      if ((pGVar6 < pGVar15) || (pGVar15 + uVar9 <= pGVar6)) goto LAB_006cf02b;
      pGVar1->pRefs[(int)((ulong)((long)pGVar6 - (long)pGVar15) >> 2) * -0x55555555] =
           pGVar1->pRefs[(int)((ulong)((long)pGVar6 - (long)pGVar15) >> 2) * -0x55555555] + 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar3->nSize);
    uVar9 = pGVar1->nObjs;
  }
LAB_006cedca:
  if (((pMan->pPars->fCoarsen != 0) && (pMan->nCoarse = 0, 0 < (int)uVar9)) &&
     (pGVar15 = pGVar1->pObjs, pGVar15 != (Gia_Obj_t *)0x0)) {
    lVar11 = 0;
    do {
      if ((~*(uint *)pGVar15 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar15) {
        iVar4 = Gia_ObjIsMuxType(pGVar15);
        if (iVar4 != 0) {
          uVar13 = *(ulong *)pGVar15;
          pGVar6 = pGVar15 + -(ulong)((uint)uVar13 & 0x1fffffff);
          pGVar10 = pGVar1->pObjs;
          if ((pGVar6 < pGVar10) || (pGVar10 + pGVar1->nObjs <= pGVar6)) {
LAB_006cf02b:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (pGVar1->pRefs[(int)((ulong)((long)pGVar6 - (long)pGVar10) >> 2) * -0x55555555] == 1) {
            *(ulong *)(pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff)) =
                 *(ulong *)(pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff)) & 0xffffffffbfffffff;
            pGVar6 = pGVar15 + -((ulong)*(uint *)&pGVar15->field_0x4 & 0x1fffffff);
            *(ulong *)(pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff)) =
                 *(ulong *)(pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff)) & 0xffffffffbfffffff;
            if (((uint)*(ulong *)(pGVar15 + -(*(ulong *)pGVar15 & 0x1fffffff)) >> 0x1e & 1) != 0)
            goto LAB_006cf069;
            *(ulong *)(pGVar15 + -(*(ulong *)pGVar15 & 0x1fffffff)) =
                 *(ulong *)(pGVar15 + -(*(ulong *)pGVar15 & 0x1fffffff)) | 0x40000000;
            pMan->nCoarse = pMan->nCoarse + 1;
            uVar13 = *(ulong *)pGVar15;
            pGVar10 = pGVar1->pObjs;
          }
          pGVar6 = pGVar15 + -(ulong)((uint)(uVar13 >> 0x20) & 0x1fffffff);
          if ((pGVar6 < pGVar10) || (pGVar10 + pGVar1->nObjs <= pGVar6)) goto LAB_006cf02b;
          if (pGVar1->pRefs[(int)((ulong)((long)pGVar6 - (long)pGVar10) >> 2) * -0x55555555] == 1) {
            *(ulong *)(pGVar15 +
                      (-(uVar13 & 0x1fffffff) -
                      ((ulong)*(uint *)&pGVar15[-(uVar13 & 0x1fffffff)].field_0x4 & 0x1fffffff))) =
                 *(ulong *)(pGVar15 +
                           (-(uVar13 & 0x1fffffff) -
                           ((ulong)*(uint *)&pGVar15[-(uVar13 & 0x1fffffff)].field_0x4 & 0x1fffffff)
                           )) & 0xffffffffbfffffff;
            uVar13 = (ulong)*(uint *)&pGVar15->field_0x4 & 0x1fffffff;
            *(ulong *)(pGVar15 +
                      (-uVar13 - ((ulong)*(uint *)&pGVar15[-uVar13].field_0x4 & 0x1fffffff))) =
                 *(ulong *)(pGVar15 +
                           (-uVar13 - ((ulong)*(uint *)&pGVar15[-uVar13].field_0x4 & 0x1fffffff))) &
                 0xffffffffbfffffff;
            uVar13 = (ulong)*(uint *)&pGVar15->field_0x4 & 0x1fffffff;
            if (((uint)*(ulong *)(pGVar15 + -uVar13) >> 0x1e & 1) != 0) {
LAB_006cf069:
              __assert_fail("Jf_ObjIsUnit(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                            ,0x49,"void Jf_ObjCleanUnit(Gia_Obj_t *)");
            }
            *(ulong *)(pGVar15 + -uVar13) = *(ulong *)(pGVar15 + -uVar13) | 0x40000000;
            pMan->nCoarse = pMan->nCoarse + 1;
          }
        }
      }
      lVar11 = lVar11 + 1;
      uVar9 = pGVar1->nObjs;
    } while ((lVar11 < (int)uVar9) &&
            (pGVar15 = pGVar1->pObjs + lVar11, pGVar1->pObjs != (Gia_Obj_t *)0x0));
  }
  pfVar7 = (float *)malloc((long)(int)uVar9 * 4);
  if (0 < (int)uVar9) {
    piVar5 = pGVar1->pRefs;
    uVar13 = 0;
    do {
      iVar4 = piVar5[uVar13];
      if (piVar5[uVar13] < 2) {
        iVar4 = 1;
      }
      pfVar7[uVar13] = (float)iVar4;
      uVar13 = uVar13 + 1;
    } while (uVar9 != uVar13);
  }
  return pfVar7;
}

Assistant:

float * Jf_ManInitRefs( Jf_Man_t * pMan )
{
    Gia_Man_t * p = pMan->pGia;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1;
    float * pRes; int i;
    assert( p->pRefs == NULL );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_ObjRefFanin0Inc( p, pObj );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        Gia_ObjRefFanin1Inc( p, pObj );
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        // discount XOR/MUX
        pCtrl = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        Gia_ObjRefDec( p, Gia_Regular(pCtrl) );
        if ( Gia_Regular(pData1) == Gia_Regular(pData0) )
            Gia_ObjRefDec( p, Gia_Regular(pData1) );
    }
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjRefFanin0Inc( p, pObj );
    // mark XOR/MUX internal nodes, which are not used elsewhere
    if ( pMan->pPars->fCoarsen )
    {
        pMan->nCoarse = 0;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 )
            {
                Jf_ObjSetUnit(Gia_ObjFanin0(Gia_ObjFanin0(pObj)));
                Jf_ObjSetUnit(Gia_ObjFanin0(Gia_ObjFanin1(pObj)));
                Jf_ObjCleanUnit(Gia_ObjFanin0(pObj)), pMan->nCoarse++;
            }
            if ( Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1 )
            {
                Jf_ObjSetUnit(Gia_ObjFanin1(Gia_ObjFanin0(pObj)));
                Jf_ObjSetUnit(Gia_ObjFanin1(Gia_ObjFanin1(pObj)));
                Jf_ObjCleanUnit(Gia_ObjFanin1(pObj)), pMan->nCoarse++;
            }
        }
    }
    // multiply by factor
    pRes = ABC_ALLOC( float, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        pRes[i] = Abc_MaxInt( 1, p->pRefs[i] );
    return pRes;
}